

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MVN.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeMVN(ConvertLayerParameters layerParameters)

{
  Rep *pRVar1;
  int iVar2;
  Type *pTVar3;
  Type *this;
  LayerUnion this_00;
  void **ppvVar4;
  long lVar5;
  long lVar6;
  MVNParameter *pMVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  RepeatedPtrFieldBase *in_stack_00000018;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  int *in_stack_00000048;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  RepeatedPtrFieldBase *local_40;
  pointer local_38;
  
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)
                      &bottom.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[3].field_2,*in_stack_00000048);
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (in_stack_00000018,(Type *)0x0);
  if (((pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     (iVar2 = 1, (pTVar3->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Must have 1 input and 1 output","");
    errorInCaffeProto(&local_78,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    iVar2 = (pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  local_40 = in_stack_00000018;
  local_38 = top.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = (pTVar3->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar4 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar4 = (void **)0x0;
  }
  if (iVar2 != 0) {
    lVar5 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_78,*(value_type **)((long)ppvVar4 + lVar5));
      lVar5 = lVar5 + 8;
    } while ((long)iVar2 * 8 != lVar5);
  }
  pRVar1 = (pTVar3->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar4 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar4 = (void **)0x0;
  }
  lVar5 = (long)(pTVar3->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar5 != 0) {
    lVar6 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,*(value_type **)((long)ppvVar4 + lVar6));
      lVar6 = lVar6 + 8;
    } while (lVar5 * 8 != lVar6);
  }
  convertCaffeMetadata
            ((pTVar3->name_).ptr_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_78,&local_58,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_40,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_38);
  pMVar7 = pTVar3->mvn_param_;
  if (this->_oneof_case_[0] == 0xa5) {
    this_00 = this->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this);
    this->_oneof_case_[0] = 0xa5;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    CoreML::Specification::MeanVarianceNormalizeLayerParams::MeanVarianceNormalizeLayerParams
              (this_00.mvn_);
    (this->layer_).mvn_ = (MeanVarianceNormalizeLayerParams *)this_00;
  }
  if (pMVar7 == (MVNParameter *)0x0) {
    pMVar7 = (MVNParameter *)&caffe::_MVNParameter_default_instance_;
  }
  (this_00.mvn_)->normalizevariance_ = pMVar7->normalize_variance_;
  (this_00.mvn_)->acrosschannels_ = pMVar7->across_channels_;
  ((this_00.convolution_)->kernelsize_).total_size_ = (int)pMVar7->eps_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeMVN(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::MVNParameter& caffeLayerParams = caffeLayer.mvn_param();
    
    
    //***************** Some Error Checking in Caffe Proto **********
    //None for this layer
    //***************************************************************
    
    Specification::MeanVarianceNormalizeLayerParams* specLayerParams = specLayer->mutable_mvn();
    specLayerParams->set_normalizevariance(caffeLayerParams.normalize_variance());
    specLayerParams->set_acrosschannels(caffeLayerParams.across_channels());
    specLayerParams->set_epsilon(caffeLayerParams.eps());
}